

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O2

void al_convert_mask_to_alpha(ALLEGRO_BITMAP *bitmap,ALLEGRO_COLOR mask_color)

{
  _Bool _Var1;
  ALLEGRO_LOCKED_REGION *pAVar2;
  int y;
  int x;
  undefined1 auVar3 [16];
  ALLEGRO_COLOR color;
  ALLEGRO_COLOR AVar4;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  ALLEGRO_COLOR mask_color_local;
  ALLEGRO_STATE state;
  
  y = 0;
  pAVar2 = al_lock_bitmap(bitmap,0,0);
  if (pAVar2 == (ALLEGRO_LOCKED_REGION *)0x0) {
    _Var1 = _al_trace_prefix("bitmap",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap.c"
                             ,0x107,"al_convert_mask_to_alpha");
    if (_Var1) {
      _al_trace_suffix("Couldn\'t lock bitmap.");
      return;
    }
  }
  else {
    al_store_state(&state,8);
    al_set_target_bitmap(bitmap);
    color = al_map_rgba('\0','\0','\0','\0');
    for (; y < bitmap->h; y = y + 1) {
      for (x = 0; x < bitmap->w; x = x + 1) {
        AVar4 = al_get_pixel(bitmap,x,y);
        mask_color_local.r._0_1_ = mask_color.r._0_1_;
        mask_color_local.r._1_1_ = mask_color.r._1_1_;
        mask_color_local.r._2_1_ = mask_color.r._2_1_;
        mask_color_local.r._3_1_ = mask_color.r._3_1_;
        mask_color_local.g._0_1_ = mask_color.g._0_1_;
        mask_color_local.g._1_1_ = mask_color.g._1_1_;
        mask_color_local.g._2_1_ = mask_color.g._2_1_;
        mask_color_local.g._3_1_ = mask_color.g._3_1_;
        mask_color_local.b._0_1_ = mask_color.b._0_1_;
        mask_color_local.b._1_1_ = mask_color.b._1_1_;
        mask_color_local.b._2_1_ = mask_color.b._2_1_;
        mask_color_local.b._3_1_ = mask_color.b._3_1_;
        mask_color_local.a._0_1_ = mask_color.a._0_1_;
        mask_color_local.a._1_1_ = mask_color.a._1_1_;
        mask_color_local.a._2_1_ = mask_color.a._2_1_;
        mask_color_local.a._3_1_ = mask_color.a._3_1_;
        local_438 = AVar4.r._0_1_;
        cStack_437 = AVar4.r._1_1_;
        cStack_436 = AVar4.r._2_1_;
        cStack_435 = AVar4.r._3_1_;
        cStack_434 = AVar4.g._0_1_;
        cStack_433 = AVar4.g._1_1_;
        cStack_432 = AVar4.g._2_1_;
        cStack_431 = AVar4.g._3_1_;
        cStack_430 = AVar4.b._0_1_;
        cStack_42f = AVar4.b._1_1_;
        cStack_42e = AVar4.b._2_1_;
        cStack_42d = AVar4.b._3_1_;
        cStack_42c = AVar4.a._0_1_;
        cStack_42b = AVar4.a._1_1_;
        cStack_42a = AVar4.a._2_1_;
        cStack_429 = AVar4.a._3_1_;
        auVar3[0] = -(local_438 == mask_color_local.r._0_1_);
        auVar3[1] = -(cStack_437 == mask_color_local.r._1_1_);
        auVar3[2] = -(cStack_436 == mask_color_local.r._2_1_);
        auVar3[3] = -(cStack_435 == mask_color_local.r._3_1_);
        auVar3[4] = -(cStack_434 == mask_color_local.g._0_1_);
        auVar3[5] = -(cStack_433 == mask_color_local.g._1_1_);
        auVar3[6] = -(cStack_432 == mask_color_local.g._2_1_);
        auVar3[7] = -(cStack_431 == mask_color_local.g._3_1_);
        auVar3[8] = -(cStack_430 == mask_color_local.b._0_1_);
        auVar3[9] = -(cStack_42f == mask_color_local.b._1_1_);
        auVar3[10] = -(cStack_42e == mask_color_local.b._2_1_);
        auVar3[0xb] = -(cStack_42d == mask_color_local.b._3_1_);
        auVar3[0xc] = -(cStack_42c == mask_color_local.a._0_1_);
        auVar3[0xd] = -(cStack_42b == mask_color_local.a._1_1_);
        auVar3[0xe] = -(cStack_42a == mask_color_local.a._2_1_);
        auVar3[0xf] = -(cStack_429 == mask_color_local.a._3_1_);
        if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
          al_put_pixel(x,y,color);
        }
      }
    }
    al_unlock_bitmap(bitmap);
    al_restore_state(&state);
  }
  return;
}

Assistant:

void al_convert_mask_to_alpha(ALLEGRO_BITMAP *bitmap, ALLEGRO_COLOR mask_color)
{
   ALLEGRO_LOCKED_REGION *lr;
   int x, y;
   ALLEGRO_COLOR pixel;
   ALLEGRO_COLOR alpha_pixel;
   ALLEGRO_STATE state;

   if (!(lr = al_lock_bitmap(bitmap, ALLEGRO_PIXEL_FORMAT_ANY, 0))) {
      ALLEGRO_ERROR("Couldn't lock bitmap.");
      return;
   }

   al_store_state(&state, ALLEGRO_STATE_TARGET_BITMAP);
   al_set_target_bitmap(bitmap);

   alpha_pixel = al_map_rgba(0, 0, 0, 0);

   for (y = 0; y < bitmap->h; y++) {
      for (x = 0; x < bitmap->w; x++) {
         pixel = al_get_pixel(bitmap, x, y);
         if (memcmp(&pixel, &mask_color, sizeof(ALLEGRO_COLOR)) == 0) {
            al_put_pixel(x, y, alpha_pixel);
         }
      }
   }

   al_unlock_bitmap(bitmap);

   al_restore_state(&state);
}